

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartsBupOutputter.cpp
# Opt level: O1

void __thiscall PartsBupOutputter::~PartsBupOutputter(PartsBupOutputter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pCVar2;
  pointer pcVar3;
  
  (this->super_BupOutputter)._vptr_BupOutputter = (_func_int **)&PTR__PartsBupOutputter_0011dc98;
  writeJSON(this);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_>_>
  ::~vector(&this->expressions);
  pCVar2 = (this->tmp).colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pCVar2 != (pointer)0x0) {
    operator_delete(pCVar2,(long)(this->tmp).colorData.
                                 super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pCVar2);
  }
  pCVar2 = (this->withFace).colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pCVar2 != (pointer)0x0) {
    operator_delete(pCVar2,(long)(this->withFace).colorData.
                                 super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pCVar2);
  }
  pCVar2 = (this->base).colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pCVar2 != (pointer)0x0) {
    operator_delete(pCVar2,(long)(this->base).colorData.
                                 super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pCVar2);
  }
  pcVar3 = (this->withMouthName)._M_dataplus._M_p;
  paVar1 = &(this->withMouthName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->withFaceName)._M_dataplus._M_p;
  paVar1 = &(this->withFaceName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->baseName)._M_dataplus._M_p;
  paVar1 = &(this->baseName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&this->partsPath);
  std::filesystem::__cxx11::path::~path(&this->basePath);
  return;
}

Assistant:

~PartsBupOutputter() {
		writeJSON();
	}